

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O1

istream * amrex::operator>>(istream *is,Geometry *g)

{
  undefined1 uVar1;
  int iVar2;
  istream *piVar3;
  char c;
  RealBox rb;
  IntVect is_per;
  Box bx;
  char local_79;
  RealBox local_78;
  IntVect local_48;
  Box local_3c;
  
  local_3c.smallend.vect[0] = 1;
  local_3c.smallend.vect[1] = 1;
  local_3c.smallend.vect[2] = 1;
  local_3c.bigend.vect[0] = 0;
  local_3c.bigend.vect[1] = 0;
  local_3c.bigend.vect[2] = 0;
  local_3c.btype.itype = 0;
  local_78.xlo[0] = 0.0;
  local_78.xlo[1] = 0.0;
  local_78.xlo[2] = 0.0;
  local_78.xhi[0] = -1.0;
  local_78.xhi[1] = -1.0;
  local_78.xhi[2] = -1.0;
  piVar3 = operator>>(is,&g->super_CoordSys);
  piVar3 = operator>>(piVar3,&local_78);
  operator>>(piVar3,&local_3c);
  *(undefined8 *)(g->domain).smallend.vect = local_3c.smallend.vect._0_8_;
  *(ulong *)((g->domain).smallend.vect + 2) =
       CONCAT44(local_3c.bigend.vect[0],local_3c.smallend.vect[2]);
  *(ulong *)(g->domain).bigend.vect = CONCAT44(local_3c.bigend.vect[1],local_3c.bigend.vect[0]);
  *(undefined8 *)((g->domain).bigend.vect + 2) = local_3c._20_8_;
  Geometry::computeRoundoffDomain(g);
  (g->prob_domain).xhi[1] = local_78.xhi[1];
  (g->prob_domain).xhi[2] = local_78.xhi[2];
  (g->prob_domain).xlo[2] = local_78.xlo[2];
  (g->prob_domain).xhi[0] = local_78.xhi[0];
  (g->prob_domain).xlo[0] = local_78.xlo[0];
  (g->prob_domain).xlo[1] = local_78.xlo[1];
  Geometry::computeRoundoffDomain(g);
  iVar2 = std::istream::peek();
  if (iVar2 == 0x50) {
    std::operator>>(is,&local_79);
    local_48.vect[0] = 0;
    local_48.vect[1] = 0;
    local_48.vect[2] = 0;
    operator>>(is,&local_48);
    (g->super_CoordSys).field_0x51 = local_48.vect[0] != 0;
    (g->super_CoordSys).field_0x52 = local_48.vect[1] != 0;
    (g->super_CoordSys).field_0x53 = local_48.vect[2] != 0;
  }
  else {
    uVar1 = *(undefined1 *)(**(long **)(DAT_00756208 + -8) + 0x53);
    *(undefined2 *)&(g->super_CoordSys).field_0x51 =
         *(undefined2 *)(**(long **)(DAT_00756208 + -8) + 0x51);
    (g->super_CoordSys).field_0x53 = uVar1;
  }
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            Geometry&     g)
{
    Box     bx;
    RealBox rb;
    is >> (CoordSys&) g >> rb >> bx;
    g.Domain(bx);
    g.ProbDomain(rb);

    int ic = is.peek();
    if (ic == static_cast<int>('P')) {
        char c;
        is >> c;
        IntVect is_per;
        is >> is_per;
        g.setPeriodicity({{AMREX_D_DECL(is_per[0],is_per[1],is_per[2])}});
    } else {
        g.setPeriodicity(DefaultGeometry().isPeriodic());
    }

    return is;
}